

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QBspTree::Node>::reallocateAndGrow
          (QArrayDataPointer<QBspTree::Node> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QBspTree::Node> *old)

{
  QArrayData *pQVar1;
  Node *pNVar2;
  bool bVar3;
  Node *pNVar4;
  qsizetype qVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QArrayDataPointer<QBspTree::Node> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QBspTree::Node> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar3)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar5 = 0;
        lVar6 = 0;
      }
      else {
        qVar5 = pQVar1->alloc;
        lVar6 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3);
      }
      auVar7 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,8,qVar5 + n + lVar6,Grow);
      this->d = (Data *)auVar7._0_8_;
      this->ptr = (Node *)auVar7._8_8_;
      goto LAB_0055071c;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (Node *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar6 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pNVar4 = this->ptr;
    pNVar2 = pNVar4 + lVar6;
    if ((old != (QArrayDataPointer<QBspTree::Node> *)0x0) || (bVar3)) {
      if ((lVar6 != 0) && (0 < lVar6)) {
        do {
          local_38.ptr[local_38.size] = *pNVar4;
          pNVar4 = pNVar4 + 1;
          local_38.size = local_38.size + 1;
        } while (pNVar4 < pNVar2);
      }
    }
    else if ((lVar6 != 0) && (0 < lVar6)) {
      do {
        local_38.ptr[local_38.size] = *pNVar4;
        pNVar4 = pNVar4 + 1;
        local_38.size = local_38.size + 1;
      } while (pNVar4 < pNVar2);
    }
  }
  pQVar1 = &this->d->super_QArrayData;
  pNVar2 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar5 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar1;
  local_38.ptr = pNVar2;
  local_38.size = qVar5;
  if (old != (QArrayDataPointer<QBspTree::Node> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar1;
    old->ptr = pNVar2;
    local_38.size = old->size;
    old->size = qVar5;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,8,0x10);
    }
  }
LAB_0055071c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }